

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcElementQuantity::~IfcElementQuantity(IfcElementQuantity *this)

{
  _func_int *p_Var1;
  _func_int *p_Var2;
  
  p_Var2 = (this->super_IfcPropertySetDefinition).super_IfcPropertyDefinition.super_IfcRoot.
           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>._vptr_ObjectHelper[-3];
  p_Var1 = (_func_int *)
           ((long)&(this->super_IfcPropertySetDefinition).super_IfcPropertyDefinition.super_IfcRoot.
                   super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>._vptr_ObjectHelper +
           (long)p_Var2);
  *(undefined8 *)
   ((long)&(this->super_IfcPropertySetDefinition).super_IfcPropertyDefinition.super_IfcRoot.
           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>._vptr_ObjectHelper +
   (long)p_Var2) = 0x93b548;
  *(undefined8 *)(&this->field_0xf8 + (long)p_Var2) = 0x93b5e8;
  *(undefined8 *)
   (&(this->super_IfcPropertySetDefinition).super_IfcPropertyDefinition.super_IfcRoot.field_0x88 +
   (long)p_Var2) = 0x93b570;
  *(undefined8 *)
   (&(this->super_IfcPropertySetDefinition).super_IfcPropertyDefinition.super_IfcRoot.field_0x98 +
   (long)p_Var2) = 0x93b598;
  *(undefined8 *)
   (&(this->super_IfcPropertySetDefinition).super_IfcPropertyDefinition.field_0xa8 + (long)p_Var2) =
       0x93b5c0;
  if (*(void **)(p_Var2 + (long)&(this->Quantities).
                                 super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>_>_>
                                 .
                                 super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) != (void *)0x0) {
    operator_delete(*(void **)(p_Var2 + (long)&(this->Quantities).
                                               super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>_>_>
                                               .
                                               super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start));
  }
  if (*(code **)(p_Var1 + 0xb8) != p_Var1 + 200) {
    operator_delete(*(code **)(p_Var1 + 0xb8));
  }
  *(undefined8 *)p_Var1 = 0x93b7d8;
  *(undefined8 *)(p_Var1 + 0xf8) = 0x93b800;
  if (*(code **)(p_Var1 + 0x60) != p_Var1 + 0x70) {
    operator_delete(*(code **)(p_Var1 + 0x60));
  }
  if (*(code **)(p_Var1 + 0x38) != p_Var1 + 0x48) {
    operator_delete(*(code **)(p_Var1 + 0x38));
  }
  if (*(code **)(p_Var1 + 0x10) != p_Var1 + 0x20) {
    operator_delete(*(code **)(p_Var1 + 0x10));
  }
  operator_delete(p_Var1);
  return;
}

Assistant:

IfcElementQuantity() : Object("IfcElementQuantity") {}